

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::ValidateMemOpCandidates
          (GlobOpt *this,Loop *loop,MemOpEmitData **inOrderEmitData,int *iEmitData)

{
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  uint uVar1;
  Type pSVar2;
  BasicBlock *pBVar3;
  BasicBlock *pBVar4;
  code *pcVar5;
  bool bVar6;
  SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  Type *ppBVar13;
  Type *ppMVar14;
  MemCopyCandidate *pMVar15;
  JITTimeFunctionBody *pJVar16;
  FunctionJITTimeInfo *pFVar17;
  char16 *pcVar18;
  char16 *pcVar19;
  int iVar20;
  Func **ppFVar21;
  MemOpCandidate *this_01;
  long lVar22;
  Instr *pIVar23;
  char16_t *form;
  Instr *pIVar24;
  bool local_f8 [8];
  bool errorInInstr;
  Instr *local_a0;
  GlobOpt *local_98;
  MemOpEmitData **local_90;
  BasicBlock *local_88;
  int *local_80;
  Phases *local_78;
  Loop *local_70;
  undefined1 local_68 [8];
  Iterator iter;
  MemCopyEmitData *local_40;
  InductionVariableChangeInfo local_31 [8];
  InductionVariableChangeInfo inductionVariableChangeInfo;
  
  local_90 = inOrderEmitData;
  local_80 = iEmitData;
  if (*iEmitData !=
      (loop->memOpInfo->candidates->
      super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
      count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ab,"(iEmitData == (int)loop->memOpInfo->candidates->Count())",
                       "iEmitData == (int)loop->memOpInfo->candidates->Count()");
    if (!bVar8) goto LAB_00475df0;
    *puVar12 = 0;
  }
  this_00 = &loop->blockList;
  pSVar2 = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  if (((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2 == this_00) ||
     ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2->next->next != this_00)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x44ad,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
    if (!bVar8) {
LAB_00475df0:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  local_68 = (undefined1  [8])loop->memOpInfo->candidates;
  iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)local_68;
  ppBVar13 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Head
                       (&this_00->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>);
  pBVar3 = (*ppBVar13)->next;
  if (pBVar3->firstInstr == (Instr *)0x0) {
    pIVar24 = (Instr *)0x0;
  }
  else {
    pIVar24 = pBVar3->firstInstr->m_prev;
  }
  pBVar4 = pBVar3->next;
  ppFVar21 = (Func **)&pBVar4->firstInstr;
  if (pBVar4 == (BasicBlock *)0x0) {
    ppFVar21 = &pBVar3->func;
  }
  lVar22 = 0x18;
  if (pBVar4 == (BasicBlock *)0x0) {
    lVar22 = 0xd0;
  }
  pIVar23 = *(Instr **)((long)&(*ppFVar21)->m_alloc + lVar22);
  if (pIVar23 != pIVar24) {
    local_88 = pBVar3;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_01 = (MemOpCandidate *)0x0;
    local_78 = (Phases *)&DAT_015bbe90;
    local_40 = (MemCopyEmitData *)0x0;
    iter.current = (NodeBase *)0x0;
    local_a0 = pIVar24;
    local_98 = this;
    do {
      if ((iter.current != (NodeBase *)0x0) && ((Instr *)iter.current[3].next != pIVar23)) {
        AssertCount = AssertCount + 1;
        iter.current = (NodeBase *)pIVar23;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x44b5,
                           "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar8) goto LAB_00475df0;
        *puVar12 = 0;
        pIVar23 = (Instr *)iter.current;
      }
      iter.current = (NodeBase *)pIVar23;
      if (this_01 == (MemOpCandidate *)0x0) {
        if (iter.list == (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_00475df0;
          *puVar12 = 0;
        }
        iter.list = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        pSVar7 = (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        if ((undefined1  [8])iter.list == local_68) break;
        ppMVar14 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                   Data((Iterator *)local_68);
        this_01 = *ppMVar14;
        if (this_01 != (MemOpCandidate *)0x0) {
          local_31[0] = (InductionVariableChangeInfo)0x0;
          bVar8 = JsUtil::
                  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::TryGetValue<unsigned_int>
                            (loop->memOpInfo->inductionVariableChangeInfoMap,&this_01->index,
                             local_31);
          if (bVar8) {
            if (((byte)local_31[0] & 0x7f) == this_01->count) {
              if (this_01->type == MEMSET) {
                pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                bVar8 = Js::Phases::IsEnabled(local_78,MemSetPhase,uVar10,uVar11);
                if (bVar8) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x44d7,
                                     "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemSetPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                                     ,"!PHASE_OFF(Js::MemSetPhase, this->func)");
                  if (!bVar8) goto LAB_00475df0;
                  *puVar12 = 0;
                }
                local_40 = (MemCopyEmitData *)
                           new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
                (local_40->super_MemOpEmitData).candidate = (MemOpCandidate *)0x0;
                (local_40->super_MemOpEmitData).stElemInstr = (Instr *)0x0;
                (local_40->super_MemOpEmitData).block = (BasicBlock *)0x0;
                (local_40->super_MemOpEmitData).inductionVar = (InductionVariableChangeInfo)0x0;
                *(undefined3 *)&(local_40->super_MemOpEmitData).field_0x19 = 0;
                (local_40->super_MemOpEmitData).bailOutKind = BailOutInvalid;
              }
              else {
                pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                bVar8 = Js::Phases::IsEnabled(local_78,MemCopyPhase,uVar10,uVar11);
                if (bVar8) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x44dc,
                                     "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::MemCopyPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                                     ,"!PHASE_OFF(Js::MemCopyPhase, this->func)");
                  if (!bVar8) goto LAB_00475df0;
                  *puVar12 = 0;
                }
                if (this_01->type != MEMCOPY) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x44de,"(candidate->IsMemCopy())","candidate->IsMemCopy()");
                  if (!bVar8) goto LAB_00475df0;
                  *puVar12 = 0;
                }
                pMVar15 = Loop::MemOpCandidate::AsMemCopy(this_01);
                local_70 = loop;
                if ((((pMVar15->super_MemOpCandidate).base == 0xffffffff) ||
                    (pMVar15->ldBase == 0xffffffff)) ||
                   (pMVar15->ldCount != (pMVar15->super_MemOpCandidate).count)) {
                  pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                  uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                  pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                  uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
                  if (bVar8) {
LAB_004758ee:
                    Output::Print(L"TRACE MemCopy:");
                    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
                    pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                    pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (pFVar17,(wchar (*) [42])local_f8);
                    uVar10 = Loop::GetLoopNumber(local_70);
                    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar18,pcVar19,(ulong)uVar10);
                    Output::Print(L"(s%d): not matching ldElem and stElem",(ulong)this_01->base);
                    Output::Print(L"\n");
                    Output::Flush();
                  }
                  else {
                    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                    uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                    pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                    uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                    bVar8 = Js::Phases::IsEnabled
                                      ((Phases *)&DAT_015cd718,MemCopyPhase,uVar10,uVar11);
                    if (bVar8) goto LAB_004758ee;
                  }
                  bVar8 = false;
                }
                else {
                  local_40 = (MemCopyEmitData *)
                             new<Memory::JitArenaAllocator>(0x28,this->alloc,0x3f1274);
                  (local_40->super_MemOpEmitData).candidate = (MemOpCandidate *)0x0;
                  (local_40->super_MemOpEmitData).stElemInstr = (Instr *)0x0;
                  (local_40->super_MemOpEmitData).block = (BasicBlock *)0x0;
                  (local_40->super_MemOpEmitData).inductionVar = (InductionVariableChangeInfo)0x0;
                  *(undefined3 *)&(local_40->super_MemOpEmitData).field_0x19 = 0;
                  (local_40->super_MemOpEmitData).bailOutKind = BailOutInvalid;
                  local_40->ldElemInstr = (Instr *)0x0;
                  bVar8 = true;
                }
                loop = local_70;
                if (!bVar8) goto LAB_0047584b;
              }
              if (local_40 == (MemCopyEmitData *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                   ,0x44ea,"(emitData)","emitData");
                if (!bVar8) goto LAB_00475df0;
                *puVar12 = 0;
              }
              (local_40->super_MemOpEmitData).block = local_88;
              (local_40->super_MemOpEmitData).inductionVar = local_31[0];
              (local_40->super_MemOpEmitData).candidate = this_01;
              bVar8 = true;
            }
            else {
              if (DAT_015d346a != '\x01') goto LAB_00475854;
              pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
              pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
              bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
              if (!bVar8) {
                pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar10,uVar11);
                if (!bVar8) {
                  pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                  uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                  pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                  uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar10,uVar11);
                  if (!bVar8) goto LAB_0047584b;
                }
              }
              Output::Print(L"TRACE MemOp:");
              pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
              pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar17,(wchar (*) [42])local_f8);
              uVar10 = Loop::GetLoopNumber(loop);
              Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar18,pcVar19,(ulong)uVar10);
              uVar1 = this_01->base;
              form = L"MemOp skipped (s%d): not matching unroll count";
LAB_00475831:
              Output::Print(form,(ulong)uVar1);
              Output::Print(L"\n");
              Output::Flush();
LAB_0047584b:
              bVar8 = false;
            }
          }
          else {
            if (DAT_015d346a == '\x01') {
              pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
              pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
              bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
              if (!bVar8) {
                pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar10,uVar11);
                if (!bVar8) {
                  pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                  uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
                  pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                  uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
                  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar10,uVar11);
                  if (!bVar8) goto LAB_0047584b;
                }
              }
              Output::Print(L"TRACE MemOp:");
              pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
              pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar17,(wchar (*) [42])local_f8);
              uVar10 = Loop::GetLoopNumber(loop);
              Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar18,pcVar19,(ulong)uVar10);
              uVar1 = this_01->base;
              form = L"MemOp skipped (s%d): no induction variable";
              goto LAB_00475831;
            }
LAB_00475854:
            bVar8 = false;
          }
          this = local_98;
          if (bVar8) goto LAB_00475ad6;
          iVar20 = 1;
          goto LAB_00475c23;
        }
        this_01 = (MemOpCandidate *)0x0;
      }
      else {
LAB_00475ad6:
        local_f8[0] = false;
        if (this_01->type == MEMSET) {
          bVar8 = InspectInstrForMemSetCandidate
                            (this,loop,(Instr *)iter.current,(MemSetEmitData *)local_40,local_f8);
        }
        else {
          bVar8 = InspectInstrForMemCopyCandidate(this,loop,(Instr *)iter.current,local_40,local_f8)
          ;
        }
        if (local_f8[0] == true) {
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                     this->alloc,local_40,0x20);
          iVar20 = 1;
LAB_00475b3e:
          bVar6 = false;
        }
        else {
          iVar20 = 0;
          bVar6 = true;
          if (bVar8 != false) {
            if (*local_80 < 1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x44fa,"(iEmitData > 0)","iEmitData > 0");
              if (!bVar8) goto LAB_00475df0;
              *puVar12 = 0;
            }
            iVar20 = 0;
            if (*local_80 == 0) {
              iVar20 = 6;
              goto LAB_00475b3e;
            }
            iVar9 = *local_80 + -1;
            *local_80 = iVar9;
            local_90[iVar9] = &local_40->super_MemOpEmitData;
            local_40 = (MemCopyEmitData *)0x0;
            this_01 = (MemOpCandidate *)0x0;
          }
        }
        if (!bVar6) goto LAB_00475c23;
      }
      pIVar23 = (Instr *)iter.current[3].next;
      pSVar7 = iter.list;
    } while (pIVar23 != local_a0);
    iter.list = pSVar7;
    iVar20 = 6;
LAB_00475c23:
    if (iVar20 != 6) {
      return false;
    }
  }
  if (iter.list == (SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    return true;
  }
  if ((undefined1  [8])iter.list != local_68) {
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
    pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemOpPhase,uVar10,uVar11);
    if (!bVar8) {
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
      pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemSetPhase,uVar10,uVar11);
      if (!bVar8) {
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
        pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
        bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,MemCopyPhase,uVar10,uVar11);
        if (!bVar8) {
          return false;
        }
      }
    }
    Output::Print(L"TRACE MemOp:");
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar18 = JITTimeFunctionBody::GetDisplayName(pJVar16);
    pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar17,(wchar (*) [42])local_f8);
    uVar10 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar18,pcVar19,(ulong)uVar10);
    Output::Print(L"Candidates not found in loop while validating");
    Output::Print(L"\n");
    Output::Flush();
    return false;
  }
  return true;
}

Assistant:

bool
GlobOpt::ValidateMemOpCandidates(Loop * loop, _Out_writes_(iEmitData) MemOpEmitData** inOrderEmitData, int& iEmitData)
{
    AnalysisAssert(iEmitData == (int)loop->memOpInfo->candidates->Count());
    // We iterate over the second block of the loop only. MemOp Works only if the loop has exactly 2 blocks
    Assert(loop->blockList.HasTwo());

    Loop::MemOpList::Iterator iter(loop->memOpInfo->candidates);
    BasicBlock* bblock = loop->blockList.Head()->next;
    Loop::MemOpCandidate* candidate = nullptr;
    MemOpEmitData* emitData = nullptr;

    // Iterate backward because the list of candidate is reversed
    FOREACH_INSTR_BACKWARD_IN_BLOCK(instr, bblock)
    {
        if (!candidate)
        {
            // Time to check next candidate
            if (!iter.Next())
            {
                // We have been through the whole list of candidates, finish
                break;
            }
            candidate = iter.Data();
            if (!candidate)
            {
                continue;
            }

            // Common check for memset and memcopy
            Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };

            // Get the inductionVariable changeInfo
            if (!loop->memOpInfo->inductionVariableChangeInfoMap->TryGetValue(candidate->index, &inductionVariableChangeInfo))
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): no induction variable"), candidate->base);
                return false;
            }

            if (inductionVariableChangeInfo.unroll != candidate->count)
            {
                TRACE_MEMOP_VERBOSE(loop, nullptr, _u("MemOp skipped (s%d): not matching unroll count"), candidate->base);
                return false;
            }

            if (candidate->IsMemSet())
            {
                Assert(!PHASE_OFF(Js::MemSetPhase, this->func));
                emitData = JitAnew(this->alloc, MemSetEmitData);
            }
            else
            {
                Assert(!PHASE_OFF(Js::MemCopyPhase, this->func));
                // Specific check for memcopy
                Assert(candidate->IsMemCopy());
                Loop::MemCopyCandidate* memcopyCandidate = candidate->AsMemCopy();

                if (memcopyCandidate->base == Js::Constants::InvalidSymID
                    || memcopyCandidate->ldBase == Js::Constants::InvalidSymID
                    || (memcopyCandidate->ldCount != memcopyCandidate->count))
                {
                    TRACE_MEMOP_PHASE(MemCopy, loop, nullptr, _u("(s%d): not matching ldElem and stElem"), candidate->base);
                    return false;
                }
                emitData = JitAnew(this->alloc, MemCopyEmitData);
            }
            Assert(emitData);
            emitData->block = bblock;
            emitData->inductionVar = inductionVariableChangeInfo;
            emitData->candidate = candidate;
        }
        bool errorInInstr = false;
        bool candidateFound = candidate->IsMemSet() ?
            InspectInstrForMemSetCandidate(loop, instr, (MemSetEmitData*)emitData, errorInInstr)
            : InspectInstrForMemCopyCandidate(loop, instr, (MemCopyEmitData*)emitData, errorInInstr);
        if (errorInInstr)
        {
            JitAdelete(this->alloc, emitData);
            return false;
        }
        if (candidateFound)
        {
            AnalysisAssert(iEmitData > 0);
            if (iEmitData == 0)
            {
                // Explicit for OACR
                break;
            }
            inOrderEmitData[--iEmitData] = emitData;
            candidate = nullptr;
            emitData = nullptr;

        }
    } NEXT_INSTR_BACKWARD_IN_BLOCK;

    if (iter.IsValid())
    {
        TRACE_MEMOP(loop, nullptr, _u("Candidates not found in loop while validating"));
        return false;
    }
    return true;
}